

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void sx__coro_wait(sx_coro_context *ctx,sx_fiber_t *pfrom,int msecs)

{
  sx__coro_return(ctx,pfrom,CORO_RET_WAIT,msecs);
  return;
}

Assistant:

void sx__coro_wait(sx_coro_context* ctx, sx_fiber_t* pfrom, int msecs)
{
    sx__coro_return(ctx, pfrom, CORO_RET_WAIT, msecs);
}